

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::StoreAnimations(ColladaLoader *this,aiScene *pScene,ColladaParser *pParser)

{
  vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> *this_00;
  aiAnimation *paVar1;
  pointer pcVar2;
  aiAnimation *paVar3;
  aiNodeAnim **ppaVar4;
  ulong uVar5;
  aiAnimation **__dest;
  pointer ppaVar6;
  size_t __n;
  ulong uVar7;
  uint uVar8;
  pointer __src;
  pointer pcVar9;
  allocator<char> local_4a9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> collectedAnimIndices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string local_438 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_438,"",(allocator<char> *)&local_478);
  StoreAnimations(this,pScene,pParser,&pParser->mAnims,local_438);
  std::__cxx11::string::~string((string *)local_438);
  this_00 = &this->mAnims;
  pcVar9 = (pointer)0x0;
  while( true ) {
    __src = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_start;
    ppaVar6 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pcVar2 = (pointer)((long)ppaVar6 - (long)__src >> 3);
    if (pcVar2 <= pcVar9) {
      if (__src != ppaVar6) {
        pScene->mNumAnimations = (uint)pcVar2;
        uVar5 = (long)(this->mAnims).
                      super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->mAnims).
                      super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
        uVar7 = 0xffffffffffffffff;
        if (-1 < (long)uVar5) {
          uVar7 = uVar5;
        }
        __dest = (aiAnimation **)operator_new__(uVar7);
        pScene->mAnimations = __dest;
        __src = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
        ppaVar6 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((long)ppaVar6 - (long)__src == 0) {
          return;
        }
        memmove(__dest,__src,(long)ppaVar6 - (long)__src);
      }
      if (ppaVar6 != __src) {
        (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
        super__Vector_impl_data._M_finish = __src;
      }
      return;
    }
    paVar1 = __src[(long)pcVar9];
    if (paVar1->mNumChannels == 1) break;
LAB_0038637f:
    pcVar9 = pcVar9 + 1;
  }
  collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438[0]._M_dataplus._M_p = pcVar9;
LAB_0038612d:
LAB_00386134:
  local_438[0]._M_dataplus._M_p = local_438[0]._M_dataplus._M_p + 1;
  if (local_438[0]._M_dataplus._M_p < (pointer)((long)ppaVar6 - (long)__src >> 3))
  goto code_r0x00386144;
  if (collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start !=
      collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    paVar3 = (aiAnimation *)operator_new(0x448);
    aiAnimation::aiAnimation(paVar3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"combinedAnim_",&local_4a9);
    std::operator+(&local_478,&local_458,(char)pcVar9 + '0');
    __n = local_478._M_string_length & 0xffffffff;
    if ((local_478._M_string_length & 0xfffffc00) != 0) {
      __n = 0x3ff;
    }
    local_438[0]._M_dataplus._M_p._0_4_ = (ai_uint32)__n;
    memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),local_478._M_dataplus._M_p,__n);
    *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + __n + 4) = 0;
    (paVar3->mName).length = (ai_uint32)__n;
    memcpy((paVar3->mName).data,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),__n);
    (paVar3->mName).data[__n] = '\0';
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_458);
    paVar3->mDuration = paVar1->mDuration;
    paVar3->mTicksPerSecond = paVar1->mTicksPerSecond;
    uVar8 = (int)((ulong)((long)collectedAnimIndices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)collectedAnimIndices.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
    paVar3->mNumChannels = uVar8;
    ppaVar4 = (aiNodeAnim **)operator_new__((ulong)uVar8 << 3);
    paVar3->mChannels = ppaVar4;
    *ppaVar4 = *paVar1->mChannels;
    *paVar1->mChannels = (aiNodeAnim *)0x0;
    aiAnimation::~aiAnimation(paVar1);
    operator_delete(paVar1,0x448);
    (this_00->super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>)._M_impl.
    super__Vector_impl_data._M_start[(long)pcVar9] = paVar3;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)collectedAnimIndices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)collectedAnimIndices.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
      paVar1 = (this_00->super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>)._M_impl.
               super__Vector_impl_data._M_start
               [collectedAnimIndices.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7]];
      paVar3->mChannels[uVar7 + 1] = *paVar1->mChannels;
      *paVar1->mChannels = (aiNodeAnim *)0x0;
      aiAnimation::~aiAnimation(paVar1);
      operator_delete(paVar1,0x448);
    }
    for (; collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
        collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1) {
      std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::erase
                (this_00,(const_iterator)
                         ((this_00->
                          super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>)._M_impl
                          .super__Vector_impl_data._M_start +
                         collectedAnimIndices.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1]));
    }
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  goto LAB_0038637f;
code_r0x00386144:
  paVar3 = __src[(long)local_438[0]._M_dataplus._M_p];
  if ((((paVar3->mNumChannels != 1) || (paVar3->mDuration != paVar1->mDuration)) ||
      (NAN(paVar3->mDuration) || NAN(paVar1->mDuration))) ||
     ((paVar3->mTicksPerSecond != paVar1->mTicksPerSecond ||
      (NAN(paVar3->mTicksPerSecond) || NAN(paVar1->mTicksPerSecond))))) goto LAB_00386134;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&collectedAnimIndices,(value_type_conflict3 *)local_438);
  __src = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  ppaVar6 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  goto LAB_0038612d;
}

Assistant:

void ColladaLoader::StoreAnimations( aiScene* pScene, const ColladaParser& pParser) {
    // recursively collect all animations from the collada scene
    StoreAnimations(pScene, pParser, &pParser.mAnims, "");

    // catch special case: many animations with the same length, each affecting only a single node.
    // we need to unite all those single-node-anims to a proper combined animation
    for( size_t a = 0; a < mAnims.size(); ++a) {
        aiAnimation* templateAnim = mAnims[a];
        if( templateAnim->mNumChannels == 1) {
            // search for other single-channel-anims with the same duration
            std::vector<size_t> collectedAnimIndices;
            for( size_t b = a+1; b < mAnims.size(); ++b) {
                aiAnimation* other = mAnims[b];
                if (other->mNumChannels == 1 && other->mDuration == templateAnim->mDuration &&
                    other->mTicksPerSecond == templateAnim->mTicksPerSecond)
                    collectedAnimIndices.push_back(b);
            }

            // if there are other animations which fit the template anim, combine all channels into a single anim
            if (!collectedAnimIndices.empty())
            {
                aiAnimation* combinedAnim = new aiAnimation();
                combinedAnim->mName = aiString(std::string("combinedAnim_") + char('0' + a));
                combinedAnim->mDuration = templateAnim->mDuration;
                combinedAnim->mTicksPerSecond = templateAnim->mTicksPerSecond;
                combinedAnim->mNumChannels = static_cast<unsigned int>(collectedAnimIndices.size() + 1);
                combinedAnim->mChannels = new aiNodeAnim*[combinedAnim->mNumChannels];
                // add the template anim as first channel by moving its aiNodeAnim to the combined animation
                combinedAnim->mChannels[0] = templateAnim->mChannels[0];
                templateAnim->mChannels[0] = NULL;
                delete templateAnim;
                // combined animation replaces template animation in the anim array
                mAnims[a] = combinedAnim;

                // move the memory of all other anims to the combined anim and erase them from the source anims
                for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
                {
                    aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
                    combinedAnim->mChannels[1 + b] = srcAnimation->mChannels[0];
                    srcAnimation->mChannels[0] = NULL;
                    delete srcAnimation;
                }

                // in a second go, delete all the single-channel-anims that we've stripped from their channels
                // back to front to preserve indices - you know, removing an element from a vector moves all elements behind the removed one
                while (!collectedAnimIndices.empty())
                {
                    mAnims.erase(mAnims.begin() + collectedAnimIndices.back());
                    collectedAnimIndices.pop_back();
                }
            }
        }
    }

    // now store all anims in the scene
    if (!mAnims.empty())
    {
        pScene->mNumAnimations = static_cast<unsigned int>(mAnims.size());
        pScene->mAnimations = new aiAnimation*[mAnims.size()];
        std::copy(mAnims.begin(), mAnims.end(), pScene->mAnimations);
    }

    mAnims.clear();
}